

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O3

string * WeatherGetSource_abi_cxx11_(void)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  char *pcVar7;
  size_type *psVar8;
  string *in_RDI;
  char t [100];
  allocator<char> local_b9;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  
  XPLMGetDatai(wdr_weather_preset.super_XDR.dr);
  uVar2 = XPLMGetDatai(wdr_weather_source.super_XDR.dr);
  uVar5 = 4;
  if (uVar2 < 4) {
    uVar5 = (ulong)uVar2;
  }
  if (bWeatherControlling == '\x01') {
    if ((uint)(dataRefs.weatherCtl + WC_METAR_XP) < 2) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else if (dataRefs.weatherCtl == WC_METAR_XP) {
      if (bWeatherCanSet == true) {
        iVar3 = XPLMGetDatai(wdr_change_mode.super_XDR.dr);
        pcVar7 = "METAR up to";
        if (iVar3 == 7) {
          pcVar7 = "XP\'s real weather above";
        }
      }
      else {
        pcVar7 = "METAR up to";
      }
      snprintf((char *)&local_98,100,"LiveTraffic, using %s %dft AGL",pcVar7,
               (ulong)(uint)dataRefs.weatherMaxMETARheight_ft);
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      strlen((char *)&local_98);
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else if (dataRefs.weatherCtl == WC_REAL_TRAFFIC) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char_const*>();
    }
  }
  else if (uVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"X-Plane Preset",&local_b9);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_b8);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_88 = *plVar6;
      lStack_80 = plVar4[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar6;
      local_98 = (long *)*plVar4;
    }
    local_90 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      lVar1 = plVar4[3];
      (in_RDI->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = (pointer)*plVar4;
      (in_RDI->field_2)._M_allocated_capacity = *psVar8;
    }
    in_RDI->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (setWeather.metar._M_string_length != 0) {
      std::__cxx11::string::append((char *)in_RDI);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,WeatherGetSource::WEATHER_SOURCES._M_elems[uVar5],
               (allocator<char> *)&local_98);
  }
  return in_RDI;
}

Assistant:

std::string WeatherGetSource ()
{
    // Preset closest to current conditions
    static std::array<const char*,10> WEATHER_PRESETS = {
        "Clear", "VFR Few", "VFR Scattered", "VFR Broken", "VFR Marginal", "IFR Non-precision", "IFR Precision", "Convective", "Large-cell Storms", "Unknown"
    };
    int preset = wdr_weather_preset.get();
    if (preset < 0 || preset > 8) preset = 9;           // 'Unknown'

    // Weather Source
    static std::array<const char*,5> WEATHER_SOURCES = {
        "X-Plane Preset", "X-Plane Real Weather", "Controlpad", "Plugin", "Unknown"
    };
    int source = wdr_weather_source.get();
    if (source < 0 || source > 3) source = 4;

    // Are we in control? Say so!
    if (WeatherInControl()) {
        char t[100];
        switch (dataRefs.GetWeatherControl()) {
            case WC_REAL_TRAFFIC:
                return "LiveTraffic using RealTraffic weather data";
            case WC_METAR_XP:
                snprintf(t, sizeof(t), "LiveTraffic, using %s %dft AGL",
                         (WeatherIsXPRealWeather() ? "XP's real weather above" : "METAR up to"),
                         dataRefs.GetWeatherMaxMetarHeight_ft());
                return std::string(t);
            case WC_NONE:
            case WC_INIT:
                return std::string("LiveTraffic, unknown");
        }
    }
    else if (source == 0) {                             // 'Preset'
        std::string s = std::string(WEATHER_SOURCES[size_t(source)]) + ", " + WEATHER_PRESETS[size_t(preset)];
        if (!setWeather.metar.empty()) {
            s += ", set from given METAR";
        }
        return s;
    }
    else
        return std::string(WEATHER_SOURCES[size_t(source)]);
    
    // Shouldn't be able to get here
    return "?";
}